

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::Attribute(XMLElement *this,char *name,char *value)

{
  bool bVar1;
  XMLAttribute *pXVar2;
  char *p;
  char *in_RDX;
  XMLElement *in_RSI;
  XMLAttribute *a;
  char *local_8;
  
  pXVar2 = FindAttribute(in_RSI,in_RDX);
  if (pXVar2 == (XMLAttribute *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    if (in_RDX != (char *)0x0) {
      p = XMLAttribute::Value((XMLAttribute *)0x2590e9);
      bVar1 = XMLUtil::StringEqual(p,in_RDX,0x7fffffff);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    local_8 = XMLAttribute::Value((XMLAttribute *)0x25910a);
  }
  return local_8;
}

Assistant:

const char* XMLElement::Attribute( const char* name, const char* value ) const
{
    const XMLAttribute* a = FindAttribute( name );
    if ( !a ) {
        return 0;
    }
    if ( !value || XMLUtil::StringEqual( a->Value(), value )) {
        return a->Value();
    }
    return 0;
}